

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall
tetgenmesh::lu_decmp(tetgenmesh *this,double (*lu) [4],int n,int *ps,double *d,int N)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  double *pdVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double adStack_48 [4];
  double scales [4];
  
  *d = 1.0;
  uVar5 = (ulong)N;
  lVar2 = (long)(n + N);
  pdVar7 = (double *)(uVar5 * 0x28 + (long)lu);
  uVar8 = uVar5;
  while( true ) {
    if (lVar2 <= (long)uVar8) {
      lVar3 = (long)(n + N + -1);
      uVar8 = 0;
      while( true ) {
        uVar4 = uVar5;
        if (lVar3 <= (long)uVar4) {
          return (bool)(-(lu[ps[lVar3]][lVar3] != 0.0) & 1);
        }
        lVar10 = (long)(int)(uVar4 + 1);
        dVar13 = 0.0;
        for (uVar5 = uVar4; (long)uVar5 < lVar2; uVar5 = uVar5 + 1) {
          dVar14 = ABS(lu[ps[uVar5]][uVar4]) * adStack_48[ps[uVar5]];
          if (dVar13 < dVar14) {
            uVar8 = uVar5 & 0xffffffff;
            dVar13 = dVar14;
          }
        }
        if ((dVar13 == 0.0) && (!NAN(dVar13))) break;
        iVar6 = (int)uVar8;
        if (iVar6 != (int)uVar4) {
          iVar1 = ps[uVar4];
          ps[uVar4] = ps[iVar6];
          ps[iVar6] = iVar1;
          *d = -*d;
        }
        iVar6 = ps[uVar4];
        dVar13 = lu[iVar6][uVar4];
        for (lVar12 = lVar10; uVar5 = uVar4 + 1, lVar12 < lVar2; lVar12 = lVar12 + 1) {
          iVar1 = ps[lVar12];
          dVar14 = lu[iVar1][uVar4] / dVar13;
          lu[iVar1][uVar4] = dVar14;
          if ((dVar14 != 0.0) || (NAN(dVar14))) {
            for (lVar11 = lVar10; lVar11 < lVar2; lVar11 = lVar11 + 1) {
              lu[iVar1][lVar11] = lu[iVar6][lVar11] * -dVar14 + lu[iVar1][lVar11];
            }
          }
        }
      }
      return false;
    }
    dVar13 = 0.0;
    pdVar9 = pdVar7;
    for (uVar4 = uVar5; (long)uVar4 < lVar2; uVar4 = uVar4 + 1) {
      dVar14 = ABS(*pdVar9);
      if (ABS(*pdVar9) <= dVar13) {
        dVar14 = dVar13;
      }
      dVar13 = dVar14;
      pdVar9 = pdVar9 + 1;
    }
    if ((dVar13 == 0.0) && (!NAN(dVar13))) break;
    adStack_48[uVar8] = 1.0 / dVar13;
    ps[uVar8] = (int)uVar8;
    uVar8 = uVar8 + 1;
    pdVar7 = pdVar7 + 4;
  }
  return false;
}

Assistant:

bool tetgenmesh::lu_decmp(REAL lu[4][4], int n, int* ps, REAL* d, int N)
{
  REAL scales[4];
  REAL pivot, biggest, mult, tempf;
  int pivotindex = 0;
  int i, j, k;

  *d = 1.0;                                      // No row interchanges yet.

  for (i = N; i < n + N; i++) {                             // For each row.
    // Find the largest element in each row for row equilibration
    biggest = 0.0;
    for (j = N; j < n + N; j++)
      if (biggest < (tempf = fabs(lu[i][j])))
        biggest  = tempf;
    if (biggest != 0.0)
      scales[i] = 1.0 / biggest;
    else {
      scales[i] = 0.0;
      return false;                            // Zero row: singular matrix.
    }
    ps[i] = i;                                 // Initialize pivot sequence.
  }

  for (k = N; k < n + N - 1; k++) {                      // For each column.
    // Find the largest element in each column to pivot around.
    biggest = 0.0;
    for (i = k; i < n + N; i++) {
      if (biggest < (tempf = fabs(lu[ps[i]][k]) * scales[ps[i]])) {
        biggest = tempf;
        pivotindex = i;
      }
    }
    if (biggest == 0.0) {
      return false;                         // Zero column: singular matrix.
    }
    if (pivotindex != k) {                         // Update pivot sequence.
      j = ps[k];
      ps[k] = ps[pivotindex];
      ps[pivotindex] = j;
      *d = -(*d);                          // ...and change the parity of d.
    }

    // Pivot, eliminating an extra variable  each time
    pivot = lu[ps[k]][k];
    for (i = k + 1; i < n + N; i++) {
      lu[ps[i]][k] = mult = lu[ps[i]][k] / pivot;
      if (mult != 0.0) {
        for (j = k + 1; j < n + N; j++)
          lu[ps[i]][j] -= mult * lu[ps[k]][j];
      }
    }
  }

  // (lu[ps[n + N - 1]][n + N - 1] == 0.0) ==> A is singular.
  return lu[ps[n + N - 1]][n + N - 1] != 0.0;
}